

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

shared_ptr<inja::ExpressionNode> __thiscall
inja::Parser::parse_expression(Parser *this,Template *tmpl)

{
  _Map_pointer *this_00;
  uint uVar1;
  FunctionStorage *this_01;
  _Base_ptr p_Var2;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  undefined4 uVar4;
  bool bVar5;
  bool bVar6;
  char *pcVar7;
  const_pointer pvVar8;
  long lVar9;
  __shared_ptr_access<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var10;
  element_type *peVar11;
  size_type sVar12;
  reference pvVar13;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Rb_tree_header *this_02;
  string_view sVar14;
  shared_ptr<inja::ExpressionNode> sVar15;
  allocator<char> local_4e1;
  string local_4e0;
  initializer_list<std::shared_ptr<inja::ExpressionNode>_> local_4c0;
  undefined1 local_4aa;
  allocator<char> local_4a9;
  string local_4a8;
  string local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  undefined1 local_428 [8];
  shared_ptr<inja::ExpressionNode> expr_2;
  string local_410;
  TemplateStorage *local_3f0;
  undefined1 local_3e8 [8];
  shared_ptr<inja::FunctionNode> function_node;
  string local_3d0;
  allocator<char> local_3a9;
  string local_3a8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_388;
  _Elt_pointer local_378;
  _Base_ptr local_370;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_368;
  _Elt_pointer local_358;
  _Base_ptr local_350;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_348;
  _Map_pointer local_338;
  _Base_ptr local_330;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_328;
  _Elt_pointer local_318;
  _Base_ptr local_310;
  undefined4 local_304;
  _Elt_pointer ppFStack_300;
  Operation operation;
  allocator<char> local_2f1;
  string local_2f0 [32];
  undefined1 local_2d0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  string_view local_2a0;
  undefined1 local_290 [8];
  FunctionData function_data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  int local_204;
  undefined1 local_200 [8];
  shared_ptr<inja::ExpressionNode> expr_1;
  undefined1 local_1e8 [8];
  shared_ptr<inja::FunctionNode> func;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_1b8;
  char *local_1a8;
  _Base_ptr local_1a0;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_198;
  size_t local_188;
  _Base_ptr local_180;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_178;
  ExpressionListNode *local_168;
  _Base_ptr local_160;
  basic_string_view<char,_std::char_traits<char>_> local_158;
  _Elt_pointer local_148;
  _Base_ptr local_140;
  basic_string_view<char,_std::char_traits<char>_> local_138;
  _Elt_pointer local_128;
  _Base_ptr local_120;
  basic_string_view<char,_std::char_traits<char>_> local_118;
  size_t local_108;
  _Base_ptr local_100;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  undefined1 local_98 [8];
  OperatorStack operator_stack;
  Arguments arguments;
  size_t current_brace_level;
  size_t current_bracket_level;
  Template *tmpl_local;
  Parser *this_local;
  shared_ptr<inja::ExpressionNode> *expr;
  
  current_brace_level = 0;
  arguments.
  super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
  ::vector((vector<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
            *)&operator_stack.c.
               super__Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node);
  ::std::
  stack<std::shared_ptr<inja::FunctionNode>,std::deque<std::shared_ptr<inja::FunctionNode>,std::allocator<std::shared_ptr<inja::FunctionNode>>>>
  ::
  stack<std::deque<std::shared_ptr<inja::FunctionNode>,std::allocator<std::shared_ptr<inja::FunctionNode>>>,void>
            ((stack<std::shared_ptr<inja::FunctionNode>,std::deque<std::shared_ptr<inja::FunctionNode>,std::allocator<std::shared_ptr<inja::FunctionNode>>>>
              *)local_98);
  while (*(int *)&(tmpl->block_storage)._M_t._M_impl != 0x22) {
    switch(*(undefined4 *)&(tmpl->block_storage)._M_t._M_impl) {
    case 9:
      get_peek_token((Parser *)tmpl);
      local_108 = *(size_t *)&(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_100 = (tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_118,"true");
      bVar3._M_str = (char *)local_100;
      bVar3._M_len = local_108;
      bVar6 = ::std::operator==(bVar3,local_118);
      if (!bVar6) {
        local_128 = *(_Elt_pointer *)
                     &(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header;
        local_120 = (tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_138,"false")
        ;
        __x_07._M_str = (char *)local_120;
        __x_07._M_len = (size_t)local_128;
        bVar6 = ::std::operator==(__x_07,local_138);
        if (!bVar6) {
          local_148 = *(_Elt_pointer *)
                       &(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header;
          local_140 = (tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_158,"null");
          __x_06._M_str = (char *)local_140;
          __x_06._M_len = (size_t)local_148;
          bVar6 = ::std::operator==(__x_06,local_158);
          if (!bVar6) {
            local_168 = *(ExpressionListNode **)
                         &(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header;
            local_160 = (tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
            ;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_178,"and");
            __x_05._M_str = (char *)local_160;
            __x_05._M_len = (size_t)local_168;
            bVar6 = ::std::operator==(__x_05,local_178);
            if (!bVar6) {
              local_188 = *(size_t *)
                           &(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header;
              local_180 = (tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_parent;
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_198,"or");
              __x_04._M_str = (char *)local_180;
              __x_04._M_len = local_188;
              bVar6 = ::std::operator==(__x_04,local_198);
              if (!bVar6) {
                local_1a8 = *(char **)&(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header.
                                       _M_header;
                local_1a0 = (tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header.
                            _M_parent;
                std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                          (&local_1b8,"in");
                __x_03._M_str = (char *)local_1a0;
                __x_03._M_len = (size_t)local_1a8;
                bVar6 = ::std::operator==(__x_03,local_1b8);
                if (!bVar6) {
                  bVar3 = *(basic_string_view<char,_std::char_traits<char>_> *)
                           &(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header;
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             &func.
                              super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount,"not");
                  bVar6 = ::std::operator==(bVar3,stack0xfffffffffffffe28);
                  if (!bVar6) {
                    if (*(int *)&(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header.
                                 _M_left == 0x15) {
                      this_02 = &(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header;
                      pvVar8 = std::basic_string_view<char,_std::char_traits<char>_>::data
                                         ((basic_string_view<char,_std::char_traits<char>_> *)
                                          this_02);
                      lVar9 = ::std::__cxx11::string::c_str();
                      expr_1.super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi =
                           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(pvVar8 + -lVar9);
                      ::std::
                      make_shared<inja::FunctionNode,std::basic_string_view<char,std::char_traits<char>>&,long>
                                ((basic_string_view<char,_std::char_traits<char>_> *)local_1e8,
                                 (long *)this_02);
                      get_next_token((Parser *)tmpl);
                      do {
                        get_next_token((Parser *)tmpl);
                        parse_expression((Parser *)local_200,tmpl);
                        bVar6 = ::std::__shared_ptr::operator_cast_to_bool
                                          ((__shared_ptr *)local_200);
                        if (bVar6) {
                          peVar11 = std::
                                    __shared_ptr_access<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    ::operator->((__shared_ptr_access<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)local_1e8);
                          peVar11->number_args = peVar11->number_args + 1;
                          peVar11 = std::
                                    __shared_ptr_access<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    ::operator->((__shared_ptr_access<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                  *)local_1e8);
                          ::std::
                          vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
                          ::emplace_back<std::shared_ptr<inja::ExpressionNode>&>
                                    ((vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
                                      *)&peVar11->arguments,
                                     (shared_ptr<inja::ExpressionNode> *)local_200);
                          local_204 = 0;
                        }
                        else {
                          local_204 = 6;
                        }
                        std::shared_ptr<inja::ExpressionNode>::~shared_ptr
                                  ((shared_ptr<inja::ExpressionNode> *)local_200);
                      } while ((local_204 == 0) &&
                              (*(int *)&(tmpl->block_storage)._M_t._M_impl == 0x12));
                      if (*(int *)&(tmpl->block_storage)._M_t._M_impl != 0x16) {
                        Token::describe_abi_cxx11_
                                  ((string *)&function_data.callback._M_invoker,
                                   (Token *)&tmpl->block_storage);
                        ::std::operator+(&local_248,"expected right parenthesis, got \'",
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&function_data.callback._M_invoker);
                        ::std::operator+(&local_228,&local_248,"\'");
                        throw_parser_error((Parser *)tmpl,&local_228);
                        ::std::__cxx11::string::~string((string *)&local_228);
                        ::std::__cxx11::string::~string((string *)&local_248);
                        ::std::__cxx11::string::~string
                                  ((string *)&function_data.callback._M_invoker);
                      }
                      this_01 = *(FunctionStorage **)((long)&(tmpl->content).field_2 + 8);
                      peVar11 = std::
                                __shared_ptr_access<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)local_1e8);
                      sVar14 = (string_view)
                               ::std::__cxx11::string::operator_cast_to_basic_string_view
                                         ((string *)&peVar11->name);
                      local_2a0 = sVar14;
                      peVar11 = std::
                                __shared_ptr_access<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)local_1e8);
                      FunctionStorage::find_function
                                ((FunctionData *)local_290,this_01,local_2a0,peVar11->number_args);
                      if (local_290._0_4_ == None) {
                        peVar11 = std::
                                  __shared_ptr_access<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  ::operator->((__shared_ptr_access<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                *)local_1e8);
                        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)(local_2d0 + 0x10),"unknown function ",&peVar11->name);
                        throw_parser_error((Parser *)tmpl,(string *)(local_2d0 + 0x10));
                        ::std::__cxx11::string::~string((string *)(local_2d0 + 0x10));
                      }
                      uVar4 = local_290._0_4_;
                      peVar11 = std::
                                __shared_ptr_access<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)local_1e8);
                      peVar11->operation = uVar4;
                      if (local_290._0_4_ == Callback) {
                        peVar11 = std::
                                  __shared_ptr_access<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  ::operator->((__shared_ptr_access<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                *)local_1e8);
                        std::
                        function<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_(std::vector<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>_&)>
                        ::operator=(&peVar11->callback,
                                    (function<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_(std::vector<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*,_std::allocator<const_nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_*>_>_&)>
                                     *)&function_data);
                      }
                      ::std::
                      vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
                      ::emplace_back<std::shared_ptr<inja::FunctionNode>&>
                                ((vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
                                  *)&operator_stack.c.
                                     super__Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
                                     ._M_impl.super__Deque_impl_data._M_finish._M_node,
                                 (shared_ptr<inja::FunctionNode> *)local_1e8);
                      FunctionStorage::FunctionData::~FunctionData((FunctionData *)local_290);
                      std::shared_ptr<inja::FunctionNode>::~shared_ptr
                                ((shared_ptr<inja::FunctionNode> *)local_1e8);
                    }
                    else {
                      ::std::allocator<char>::allocator();
                      ::std::__cxx11::string::
                      string<std::basic_string_view<char,std::char_traits<char>>,void>
                                (local_2f0,
                                 (basic_string_view<char,_std::char_traits<char>_> *)
                                 &(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header,
                                 &local_2f1);
                      pvVar8 = std::basic_string_view<char,_std::char_traits<char>_>::data
                                         ((basic_string_view<char,_std::char_traits<char>_> *)
                                          &(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header)
                      ;
                      lVar9 = ::std::__cxx11::string::c_str();
                      ppFStack_300 = (_Elt_pointer)(pvVar8 + -lVar9);
                      ::std::make_shared<inja::DataNode,std::__cxx11::string,long>
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_2d0,(long *)local_2f0);
                      ::std::
                      vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
                      ::emplace_back<std::shared_ptr<inja::DataNode>>
                                ((vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
                                  *)&operator_stack.c.
                                     super__Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
                                     ._M_impl.super__Deque_impl_data._M_finish._M_node,
                                 (shared_ptr<inja::DataNode> *)local_2d0);
                      std::shared_ptr<inja::DataNode>::~shared_ptr
                                ((shared_ptr<inja::DataNode> *)local_2d0);
                      ::std::__cxx11::string::~string(local_2f0);
                      ::std::allocator<char>::~allocator(&local_2f1);
                    }
                    break;
                  }
                }
              }
            }
            goto LAB_0016dc4d;
          }
        }
      }
      if ((arguments.
           super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) &&
         (current_brace_level == 0)) {
        p_Var2 = (tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        tmpl[1].root.super_AstNode.pos =
             *(size_t *)&(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header;
        tmpl[1].root.nodes.
        super__Vector_base<std::shared_ptr<inja::AstNode>,_std::allocator<std::shared_ptr<inja::AstNode>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var2;
        pcVar7 = (char *)::std::__cxx11::string::c_str();
        add_literal((Parser *)tmpl,
                    (Arguments *)
                    &operator_stack.c.
                     super__Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node,pcVar7);
      }
      break;
    case 10:
      if ((arguments.
           super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) &&
         (current_brace_level == 0)) {
        p_Var2 = (tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        tmpl[1].root.super_AstNode.pos =
             *(size_t *)&(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header;
        tmpl[1].root.nodes.
        super__Vector_base<std::shared_ptr<inja::AstNode>,_std::allocator<std::shared_ptr<inja::AstNode>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var2;
        pcVar7 = (char *)::std::__cxx11::string::c_str();
        add_literal((Parser *)tmpl,
                    (Arguments *)
                    &operator_stack.c.
                     super__Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node,pcVar7);
      }
      break;
    case 0xb:
      if ((arguments.
           super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) &&
         (current_brace_level == 0)) {
        p_Var2 = (tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        tmpl[1].root.super_AstNode.pos =
             *(size_t *)&(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header;
        tmpl[1].root.nodes.
        super__Vector_base<std::shared_ptr<inja::AstNode>,_std::allocator<std::shared_ptr<inja::AstNode>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var2;
        pcVar7 = (char *)::std::__cxx11::string::c_str();
        add_literal((Parser *)tmpl,
                    (Arguments *)
                    &operator_stack.c.
                     super__Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node,pcVar7);
      }
      break;
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x13:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x20:
LAB_0016dc4d:
      switch(*(undefined4 *)&(tmpl->block_storage)._M_t._M_impl) {
      case 9:
        local_318 = *(_Elt_pointer *)
                     &(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header;
        local_310 = (tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_328,"and");
        __x_02._M_str = (char *)local_310;
        __x_02._M_len = (size_t)local_318;
        bVar6 = ::std::operator==(__x_02,local_328);
        if (bVar6) {
          local_304 = 1;
        }
        else {
          local_338 = *(_Map_pointer *)
                       &(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header;
          local_330 = (tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_348,"or");
          __x_01._M_str = (char *)local_330;
          __x_01._M_len = (size_t)local_338;
          bVar6 = ::std::operator==(__x_01,local_348);
          if (bVar6) {
            local_304 = 2;
          }
          else {
            local_358 = *(_Elt_pointer *)
                         &(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header;
            local_350 = (tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
            ;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      (&local_368,"in");
            __x_00._M_str = (char *)local_350;
            __x_00._M_len = (size_t)local_358;
            bVar6 = ::std::operator==(__x_00,local_368);
            if (bVar6) {
              local_304 = 3;
            }
            else {
              local_378 = *(_Elt_pointer *)
                           &(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header;
              local_370 = (tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_parent;
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        (&local_388,"not");
              __x._M_str = (char *)local_370;
              __x._M_len = (size_t)local_378;
              bVar6 = ::std::operator==(__x,local_388);
              if (bVar6) {
                local_304 = 0;
              }
              else {
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3a8,"unknown operator in parser.",&local_3a9);
                throw_parser_error((Parser *)tmpl,&local_3a8);
                ::std::__cxx11::string::~string((string *)&local_3a8);
                ::std::allocator<char>::~allocator(&local_3a9);
              }
            }
          }
        }
        break;
      default:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3d0,"unknown operator in parser.",
                   (allocator<char> *)
                   ((long)&function_node.
                           super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 7));
        throw_parser_error((Parser *)tmpl,&local_3d0);
        ::std::__cxx11::string::~string((string *)&local_3d0);
        ::std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&function_node.
                           super___shared_ptr<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 7));
        break;
      case 0xc:
        local_304 = 10;
        break;
      case 0xd:
        local_304 = 0xb;
        break;
      case 0xe:
        local_304 = 0xc;
        break;
      case 0xf:
        local_304 = 0xd;
        break;
      case 0x10:
        local_304 = 0xf;
        break;
      case 0x11:
        local_304 = 0xe;
        break;
      case 0x13:
        local_304 = 0x10;
        break;
      case 0x1b:
        local_304 = 4;
        break;
      case 0x1c:
        local_304 = 5;
        break;
      case 0x1d:
        local_304 = 6;
        break;
      case 0x1e:
        local_304 = 7;
        break;
      case 0x1f:
        local_304 = 8;
        break;
      case 0x20:
        local_304 = 9;
      }
      pvVar8 = std::basic_string_view<char,_std::char_traits<char>_>::data
                         ((basic_string_view<char,_std::char_traits<char>_> *)
                          &(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header);
      lVar9 = ::std::__cxx11::string::c_str();
      local_3f0 = (TemplateStorage *)(pvVar8 + -lVar9);
      ::std::make_shared<inja::FunctionNode,inja::FunctionStorage::Operation&,long>
                ((Operation *)local_3e8,(long *)&local_304);
      while( true ) {
        bVar5 = std::
                stack<std::shared_ptr<inja::FunctionNode>,_std::deque<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>_>
                ::empty((stack<std::shared_ptr<inja::FunctionNode>,_std::deque<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>_>
                         *)local_98);
        bVar6 = false;
        if (!bVar5) {
          p_Var10 = (__shared_ptr_access<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)std::
                       stack<std::shared_ptr<inja::FunctionNode>,_std::deque<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>_>
                       ::top((stack<std::shared_ptr<inja::FunctionNode>,_std::deque<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>_>
                              *)local_98);
          peVar11 = std::
                    __shared_ptr_access<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->(p_Var10);
          uVar1 = peVar11->precedence;
          peVar11 = std::
                    __shared_ptr_access<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_3e8);
          bVar6 = true;
          if (uVar1 <= peVar11->precedence) {
            p_Var10 = (__shared_ptr_access<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)std::
                         stack<std::shared_ptr<inja::FunctionNode>,_std::deque<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>_>
                         ::top((stack<std::shared_ptr<inja::FunctionNode>,_std::deque<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>_>
                                *)local_98);
            peVar11 = std::
                      __shared_ptr_access<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->(p_Var10);
            uVar1 = peVar11->precedence;
            peVar11 = std::
                      __shared_ptr_access<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_3e8);
            bVar6 = false;
            if (uVar1 == peVar11->precedence) {
              peVar11 = std::
                        __shared_ptr_access<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<inja::FunctionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)local_3e8);
              bVar6 = peVar11->associativity == Left;
            }
          }
        }
        if (!bVar6) break;
        add_operator((Parser *)tmpl,
                     (Arguments *)
                     &operator_stack.c.
                      super__Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node,(OperatorStack *)local_98);
      }
      ::std::
      stack<std::shared_ptr<inja::FunctionNode>,std::deque<std::shared_ptr<inja::FunctionNode>,std::allocator<std::shared_ptr<inja::FunctionNode>>>>
      ::emplace<std::shared_ptr<inja::FunctionNode>&>
                ((stack<std::shared_ptr<inja::FunctionNode>,std::deque<std::shared_ptr<inja::FunctionNode>,std::allocator<std::shared_ptr<inja::FunctionNode>>>>
                  *)local_98,(shared_ptr<inja::FunctionNode> *)local_3e8);
      std::shared_ptr<inja::FunctionNode>::~shared_ptr((shared_ptr<inja::FunctionNode> *)local_3e8);
      break;
    case 0x12:
      if ((arguments.
           super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) &&
         (current_brace_level == 0)) goto LAB_0016e4f0;
      break;
    case 0x14:
      if ((arguments.
           super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) &&
         (current_brace_level == 0)) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_410,"unexpected \':\'",
                   (allocator<char> *)
                   ((long)&expr_2.
                           super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 7));
        throw_parser_error((Parser *)tmpl,&local_410);
        ::std::__cxx11::string::~string((string *)&local_410);
        ::std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&expr_2.
                           super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 7));
      }
      break;
    case 0x15:
      get_next_token((Parser *)tmpl);
      parse_expression((Parser *)local_428,tmpl);
      if (*(int *)&(tmpl->block_storage)._M_t._M_impl != 0x16) {
        Token::describe_abi_cxx11_(&local_488,(Token *)&tmpl->block_storage);
        ::std::operator+(&local_468,"expected right parenthesis, got \'",&local_488);
        ::std::operator+(&local_448,&local_468,"\'");
        throw_parser_error((Parser *)tmpl,&local_448);
        ::std::__cxx11::string::~string((string *)&local_448);
        ::std::__cxx11::string::~string((string *)&local_468);
        ::std::__cxx11::string::~string((string *)&local_488);
      }
      bVar6 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_428);
      if (!bVar6) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_4a8,"empty expression in parentheses",&local_4a9);
        throw_parser_error((Parser *)tmpl,&local_4a8);
        ::std::__cxx11::string::~string((string *)&local_4a8);
        ::std::allocator<char>::~allocator(&local_4a9);
      }
      ::std::
      vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
      ::emplace_back<std::shared_ptr<inja::ExpressionNode>&>
                ((vector<std::shared_ptr<inja::ExpressionNode>,std::allocator<std::shared_ptr<inja::ExpressionNode>>>
                  *)&operator_stack.c.
                     super__Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node,
                 (shared_ptr<inja::ExpressionNode> *)local_428);
      std::shared_ptr<inja::ExpressionNode>::~shared_ptr
                ((shared_ptr<inja::ExpressionNode> *)local_428);
      break;
    default:
      goto LAB_0016e4f0;
    case 0x17:
      if ((arguments.
           super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) &&
         (current_brace_level == 0)) {
        tmpl[1].root.super_AstNode.pos =
             *(size_t *)&(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header;
        tmpl[1].root.nodes.
        super__Vector_base<std::shared_ptr<inja::AstNode>,_std::allocator<std::shared_ptr<inja::AstNode>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      }
      current_brace_level = current_brace_level + 1;
      break;
    case 0x18:
      if (current_brace_level == 0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c8,"unexpected \']\'",&local_c9);
        throw_parser_error((Parser *)tmpl,&local_c8);
        ::std::__cxx11::string::~string((string *)&local_c8);
        ::std::allocator<char>::~allocator(&local_c9);
      }
      current_brace_level = current_brace_level - 1;
      if ((arguments.
           super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) &&
         (current_brace_level == 0)) {
        pcVar7 = (char *)::std::__cxx11::string::c_str();
        add_literal((Parser *)tmpl,
                    (Arguments *)
                    &operator_stack.c.
                     super__Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node,pcVar7);
      }
      break;
    case 0x19:
      if ((arguments.
           super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) &&
         (current_brace_level == 0)) {
        tmpl[1].root.super_AstNode.pos =
             *(size_t *)&(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header;
        tmpl[1].root.nodes.
        super__Vector_base<std::shared_ptr<inja::AstNode>,_std::allocator<std::shared_ptr<inja::AstNode>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)(tmpl->block_storage)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      }
      arguments.
      super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)&((arguments.
                              super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                            super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr + 1);
      break;
    case 0x1a:
      if (arguments.
          super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f0,"unexpected \'}\'",&local_f1);
        throw_parser_error((Parser *)tmpl,&local_f0);
        ::std::__cxx11::string::~string((string *)&local_f0);
        ::std::allocator<char>::~allocator(&local_f1);
      }
      arguments.
      super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)&arguments.
                            super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage[-1].
                            super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi + 7);
      if ((arguments.
           super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) &&
         (current_brace_level == 0)) {
        pcVar7 = (char *)::std::__cxx11::string::c_str();
        add_literal((Parser *)tmpl,
                    (Arguments *)
                    &operator_stack.c.
                     super__Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node,pcVar7);
      }
    }
    get_next_token((Parser *)tmpl);
  }
LAB_0016e4f0:
  while( true ) {
    bVar6 = std::
            stack<std::shared_ptr<inja::FunctionNode>,_std::deque<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>_>
            ::empty((stack<std::shared_ptr<inja::FunctionNode>,_std::deque<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>_>
                     *)local_98);
    if (((bVar6 ^ 0xffU) & 1) == 0) break;
    add_operator((Parser *)tmpl,
                 (Arguments *)
                 &operator_stack.c.
                  super__Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node,(OperatorStack *)local_98);
  }
  local_4aa = 0;
  std::shared_ptr<inja::ExpressionNode>::shared_ptr((shared_ptr<inja::ExpressionNode> *)this);
  sVar12 = std::
           vector<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
           ::size((vector<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
                   *)&operator_stack.c.
                      super__Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node);
  if (sVar12 == 1) {
    this_00 = &operator_stack.c.
               super__Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node;
    pvVar13 = std::
              vector<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
              ::operator[]((vector<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
                            *)this_00,0);
    std::shared_ptr<inja::ExpressionNode>::operator=
              ((shared_ptr<inja::ExpressionNode> *)this,pvVar13);
    std::initializer_list<std::shared_ptr<inja::ExpressionNode>_>::initializer_list(&local_4c0);
    std::
    vector<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
    ::operator=((vector<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
                 *)this_00,local_4c0);
  }
  else {
    sVar12 = std::
             vector<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
             ::size((vector<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
                     *)&operator_stack.c.
                        super__Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node);
    if (1 < sVar12) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4e0,"malformed expression",&local_4e1);
      throw_parser_error((Parser *)tmpl,&local_4e0);
      ::std::__cxx11::string::~string((string *)&local_4e0);
      ::std::allocator<char>::~allocator(&local_4e1);
    }
  }
  local_204 = 1;
  local_4aa = 1;
  std::
  stack<std::shared_ptr<inja::FunctionNode>,_std::deque<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>_>
  ::~stack((stack<std::shared_ptr<inja::FunctionNode>,_std::deque<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>_>
            *)local_98);
  std::
  vector<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
  ::~vector((vector<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
             *)&operator_stack.c.
                super__Deque_base<std::shared_ptr<inja::FunctionNode>,_std::allocator<std::shared_ptr<inja::FunctionNode>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node);
  sVar15.super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar15.super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<inja::ExpressionNode>)
         sVar15.super___shared_ptr<inja::ExpressionNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ExpressionNode> parse_expression(Template& tmpl) {
    size_t current_bracket_level {0};
    size_t current_brace_level {0};
    Arguments arguments;
    OperatorStack operator_stack;

    while (tok.kind != Token::Kind::Eof) {
      // Literals
      switch (tok.kind) {
      case Token::Kind::String: {
        if (current_brace_level == 0 && current_bracket_level == 0) {
          literal_start = tok.text;
          add_literal(arguments, tmpl.content.c_str());
        }
      } break;
      case Token::Kind::Number: {
        if (current_brace_level == 0 && current_bracket_level == 0) {
          literal_start = tok.text;
          add_literal(arguments, tmpl.content.c_str());
        }
      } break;
      case Token::Kind::LeftBracket: {
        if (current_brace_level == 0 && current_bracket_level == 0) {
          literal_start = tok.text;
        }
        current_bracket_level += 1;
      } break;
      case Token::Kind::LeftBrace: {
        if (current_brace_level == 0 && current_bracket_level == 0) {
          literal_start = tok.text;
        }
        current_brace_level += 1;
      } break;
      case Token::Kind::RightBracket: {
        if (current_bracket_level == 0) {
          throw_parser_error("unexpected ']'");
        }

        current_bracket_level -= 1;
        if (current_brace_level == 0 && current_bracket_level == 0) {
          add_literal(arguments, tmpl.content.c_str());
        }
      } break;
      case Token::Kind::RightBrace: {
        if (current_brace_level == 0) {
          throw_parser_error("unexpected '}'");
        }

        current_brace_level -= 1;
        if (current_brace_level == 0 && current_bracket_level == 0) {
          add_literal(arguments, tmpl.content.c_str());
        }
      } break;
      case Token::Kind::Id: {
        get_peek_token();

        // Data Literal
        if (tok.text == static_cast<decltype(tok.text)>("true") || tok.text == static_cast<decltype(tok.text)>("false") ||
            tok.text == static_cast<decltype(tok.text)>("null")) {
          if (current_brace_level == 0 && current_bracket_level == 0) {
            literal_start = tok.text;
            add_literal(arguments, tmpl.content.c_str());
          }

          // Operator
        } else if (tok.text == "and" || tok.text == "or" || tok.text == "in" || tok.text == "not") {
          goto parse_operator;

          // Functions
        } else if (peek_tok.kind == Token::Kind::LeftParen) {
          auto func = std::make_shared<FunctionNode>(tok.text, tok.text.data() - tmpl.content.c_str());
          get_next_token();
          do {
            get_next_token();
            auto expr = parse_expression(tmpl);
            if (!expr) {
              break;
            }
            func->number_args += 1;
            func->arguments.emplace_back(expr);
          } while (tok.kind == Token::Kind::Comma);
          if (tok.kind != Token::Kind::RightParen) {
            throw_parser_error("expected right parenthesis, got '" + tok.describe() + "'");
          }

          auto function_data = function_storage.find_function(func->name, func->number_args);
          if (function_data.operation == FunctionStorage::Operation::None) {
            throw_parser_error("unknown function " + func->name);
          }
          func->operation = function_data.operation;
          if (function_data.operation == FunctionStorage::Operation::Callback) {
            func->callback = function_data.callback;
          }
          arguments.emplace_back(func);

          // Variables
        } else {
          arguments.emplace_back(std::make_shared<DataNode>(static_cast<std::string>(tok.text), tok.text.data() - tmpl.content.c_str()));
        }

        // Operators
      } break;
      case Token::Kind::Equal:
      case Token::Kind::NotEqual:
      case Token::Kind::GreaterThan:
      case Token::Kind::GreaterEqual:
      case Token::Kind::LessThan:
      case Token::Kind::LessEqual:
      case Token::Kind::Plus:
      case Token::Kind::Minus:
      case Token::Kind::Times:
      case Token::Kind::Slash:
      case Token::Kind::Power:
      case Token::Kind::Percent:
      case Token::Kind::Dot: {

      parse_operator:
        FunctionStorage::Operation operation;
        switch (tok.kind) {
        case Token::Kind::Id: {
          if (tok.text == "and") {
            operation = FunctionStorage::Operation::And;
          } else if (tok.text == "or") {
            operation = FunctionStorage::Operation::Or;
          } else if (tok.text == "in") {
            operation = FunctionStorage::Operation::In;
          } else if (tok.text == "not") {
            operation = FunctionStorage::Operation::Not;
          } else {
            throw_parser_error("unknown operator in parser.");
          }
        } break;
        case Token::Kind::Equal: {
          operation = FunctionStorage::Operation::Equal;
        } break;
        case Token::Kind::NotEqual: {
          operation = FunctionStorage::Operation::NotEqual;
        } break;
        case Token::Kind::GreaterThan: {
          operation = FunctionStorage::Operation::Greater;
        } break;
        case Token::Kind::GreaterEqual: {
          operation = FunctionStorage::Operation::GreaterEqual;
        } break;
        case Token::Kind::LessThan: {
          operation = FunctionStorage::Operation::Less;
        } break;
        case Token::Kind::LessEqual: {
          operation = FunctionStorage::Operation::LessEqual;
        } break;
        case Token::Kind::Plus: {
          operation = FunctionStorage::Operation::Add;
        } break;
        case Token::Kind::Minus: {
          operation = FunctionStorage::Operation::Subtract;
        } break;
        case Token::Kind::Times: {
          operation = FunctionStorage::Operation::Multiplication;
        } break;
        case Token::Kind::Slash: {
          operation = FunctionStorage::Operation::Division;
        } break;
        case Token::Kind::Power: {
          operation = FunctionStorage::Operation::Power;
        } break;
        case Token::Kind::Percent: {
          operation = FunctionStorage::Operation::Modulo;
        } break;
        case Token::Kind::Dot: {
          operation = FunctionStorage::Operation::AtId;
        } break;
        default: {
          throw_parser_error("unknown operator in parser.");
        }
        }
        auto function_node = std::make_shared<FunctionNode>(operation, tok.text.data() - tmpl.content.c_str());

        while (!operator_stack.empty() &&
               ((operator_stack.top()->precedence > function_node->precedence) ||
                (operator_stack.top()->precedence == function_node->precedence && function_node->associativity == FunctionNode::Associativity::Left))) {
          add_operator(arguments, operator_stack);
        }

        operator_stack.emplace(function_node);
      } break;
      case Token::Kind::Comma: {
        if (current_brace_level == 0 && current_bracket_level == 0) {
          goto break_loop;
        }
      } break;
      case Token::Kind::Colon: {
        if (current_brace_level == 0 && current_bracket_level == 0) {
          throw_parser_error("unexpected ':'");
        }
      } break;
      case Token::Kind::LeftParen: {
        get_next_token();
        auto expr = parse_expression(tmpl);
        if (tok.kind != Token::Kind::RightParen) {
            throw_parser_error("expected right parenthesis, got '" + tok.describe() + "'");
        }
        if (!expr) {
          throw_parser_error("empty expression in parentheses");
        }
        arguments.emplace_back(expr);
      } break;
      default:
        goto break_loop;
      }

      get_next_token();
    }

  break_loop:
    while (!operator_stack.empty()) {
      add_operator(arguments, operator_stack);
    }

    std::shared_ptr<ExpressionNode> expr;
    if (arguments.size() == 1) {
      expr = arguments[0];
      arguments = {};
    } else if (arguments.size() > 1) {
      throw_parser_error("malformed expression");
    }
    return expr;
  }